

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

TransRepeatRangeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TransRepeatRangeSyntax,slang::syntax::TransRepeatRangeSyntax_const&>
          (BumpAllocator *this,TransRepeatRangeSyntax *args)

{
  undefined4 uVar1;
  TransRepeatRangeSyntax *pTVar2;
  long lVar3;
  TransRepeatRangeSyntax *pTVar4;
  byte bVar5;
  
  bVar5 = 0;
  pTVar2 = (TransRepeatRangeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TransRepeatRangeSyntax *)this->endPtr < pTVar2 + 1) {
    pTVar2 = (TransRepeatRangeSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pTVar2 + 1);
  }
  pTVar4 = pTVar2;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
    (pTVar4->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
    *(undefined4 *)&(pTVar4->super_SyntaxNode).field_0x4 = uVar1;
    args = (TransRepeatRangeSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pTVar4 = (TransRepeatRangeSyntax *)((long)pTVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pTVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }